

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O3

BOOL __thiscall Js::HeapArgumentsObject::DeleteItemAt(HeapArgumentsObject *this,uint32 index)

{
  BOOLEAN BVar1;
  Recycler *alloc;
  BVSparse<Memory::Recycler> *pBVar2;
  BOOL BVar3;
  Type *addr;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  BVar3 = 0;
  if (index < this->formalCount) {
    addr = &this->deletedArgs;
    pBVar2 = (this->deletedArgs).ptr;
    if (pBVar2 == (BVSparse<Memory::Recycler> *)0x0) {
      data._32_8_ = ((((((this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr)->recycler;
      local_60 = (undefined1  [8])&BVSparse<Memory::Recycler>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_5c11b8c;
      data.filename._0_4_ = 0x9d;
      alloc = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_60);
      pBVar2 = (BVSparse<Memory::Recycler> *)new<Memory::Recycler>(0x20,alloc,0x387914);
      (pBVar2->head).ptr = (BVSparseNode<Memory::Recycler> *)0x0;
      (pBVar2->lastFoundIndex).ptr = (BVSparseNode<Memory::Recycler> *)0x0;
      pBVar2->alloc = (Type)data._32_8_;
      (pBVar2->lastUsedNodePrevNextField).ptr =
           (WriteBarrierPtr<BVSparseNode<Memory::Recycler>_> *)0x0;
      data._32_8_ = addr;
      Memory::Recycler::WBSetBit((char *)&pBVar2->lastUsedNodePrevNextField);
      addr = (Type *)data._32_8_;
      (pBVar2->lastUsedNodePrevNextField).ptr =
           (WriteBarrierPtr<BVSparseNode<Memory::Recycler>_> *)pBVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&pBVar2->lastUsedNodePrevNextField);
      Memory::Recycler::WBSetBit((char *)addr);
      (this->deletedArgs).ptr = pBVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      pBVar2 = (this->deletedArgs).ptr;
    }
    BVar1 = BVSparse<Memory::Recycler>::Test(pBVar2,index);
    BVar3 = 0;
    if (BVar1 == '\0') {
      BVSparse<Memory::Recycler>::Set(addr->ptr,index);
      BVar3 = 1;
    }
  }
  return BVar3;
}

Assistant:

BOOL HeapArgumentsObject::DeleteItemAt(uint32 index)
    {
        if (index < formalCount)
        {
            if (this->deletedArgs == nullptr)
            {
                Recycler *recycler = GetScriptContext()->GetRecycler();
                deletedArgs = RecyclerNew(recycler, BVSparse<Recycler>, recycler);
            }

            if (!this->deletedArgs->Test(index))
            {
                this->deletedArgs->Set(index);
                return true;
            }
        }

        return false;
    }